

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O1

econf_err traverse_conf_dirs(econf_file ***key_files,char **config_dirs,size_t *size,char *path,
                            char *config_suffix,char *delim,char *comment,_Bool join_same_entries,
                            _Bool python_style,_func__Bool_char_ptr_void_ptr *callback,
                            void *callback_data)

{
  size_t sVar1;
  bool bVar2;
  econf_file ***pppeVar3;
  econf_err eVar4;
  int iVar5;
  econf_err eVar6;
  size_t sVar7;
  size_t sVar8;
  char *__dest;
  char *__dest_00;
  char *pcVar9;
  econf_file **ppeVar10;
  econf_err unaff_EBP;
  ulong uVar11;
  int k;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  dirent **local_80;
  int local_74;
  econf_file *local_70;
  econf_err local_64;
  char *local_60;
  econf_file ***local_58;
  size_t *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  
  if (config_dirs == (char **)0x0) {
    unaff_EBP = ECONF_NOFILE;
  }
  else {
    local_74 = 0;
    local_58 = key_files;
    local_50 = size;
    local_48 = delim;
    local_40 = config_dirs;
    local_38 = path;
    do {
      pcVar9 = config_dirs[local_74];
      if (pcVar9 == (char *)0x0) {
        return ECONF_SUCCESS;
      }
      sVar7 = strlen(path);
      sVar8 = strlen(pcVar9);
      __dest = (char *)malloc(sVar8 + sVar7 + 1);
      if (__dest == (char *)0x0) {
        bVar14 = false;
        unaff_EBP = ECONF_NOMEM;
      }
      else {
        __dest_00 = stpcpy(__dest,path);
        strcpy(__dest_00,pcVar9);
        eVar4 = scandir(__dest,&local_80,(__selector *)0x0,alphasort);
        eVar6 = ECONF_SUCCESS;
        if (0 < (int)eVar4) {
          uVar13 = (ulong)eVar4;
          bVar14 = true;
          uVar11 = 0;
          local_64 = unaff_EBP;
          local_60 = __dest;
          do {
            pcVar9 = local_80[uVar11]->d_name;
            sVar7 = strlen(pcVar9);
            sVar8 = strlen(config_suffix);
            if ((((sVar8 < sVar7) &&
                 (iVar5 = strncmp(pcVar9 + (sVar7 - sVar8),config_suffix,sVar8), iVar5 == 0)) &&
                (iVar5 = strcmp(pcVar9,"."), iVar5 != 0)) &&
               (iVar5 = strcmp(pcVar9,".."), iVar5 != 0)) {
              pcVar9 = combine_strings(local_60,pcVar9,'/');
              local_70 = (econf_file *)0x0;
              eVar6 = econf_newKeyFile_with_options(&local_70,"");
              if (eVar6 == ECONF_SUCCESS) {
                local_70->join_same_entries = join_same_entries;
                local_70->python_style = python_style;
                eVar6 = read_file_with_callback
                                  (&local_70,pcVar9,local_48,comment,callback,callback_data);
                free(pcVar9);
                pppeVar3 = local_58;
                uVar12 = uVar11;
                if (eVar6 != ECONF_SUCCESS || local_70 == (econf_file *)0x0) {
                  do {
                    free(local_80[uVar12]);
                    uVar12 = uVar12 + 1;
                  } while (uVar13 != uVar12);
                  free(local_80);
                  goto LAB_00105df8;
                }
                local_70->on_merge_delete = true;
                sVar1 = *local_50;
                (*local_58)[sVar1 - 1] = local_70;
                ppeVar10 = *local_58;
                *local_50 = sVar1 + 1;
                ppeVar10 = (econf_file **)realloc(ppeVar10,sVar1 * 8 + 8);
                *pppeVar3 = ppeVar10;
                bVar2 = true;
              }
              else {
LAB_00105df8:
                eVar4 = eVar6;
                bVar2 = false;
              }
              if (bVar2) goto LAB_00105caf;
              bVar2 = false;
            }
            else {
LAB_00105caf:
              free(local_80[uVar11]);
              bVar2 = true;
            }
            path = local_38;
            config_dirs = local_40;
            __dest = local_60;
            unaff_EBP = local_64;
            if (!bVar2) break;
            uVar11 = uVar11 + 1;
            bVar14 = uVar11 < uVar13;
          } while (uVar11 != uVar13);
          eVar6 = eVar4;
          if (!bVar14) {
            free(local_80);
            eVar6 = ECONF_SUCCESS;
          }
        }
        local_74 = local_74 + 1;
        free(__dest);
        bVar14 = eVar6 == ECONF_SUCCESS;
        if (!bVar14) {
          unaff_EBP = eVar6;
        }
      }
    } while (bVar14);
  }
  return unaff_EBP;
}

Assistant:

econf_err traverse_conf_dirs(econf_file ***key_files,
			     char *config_dirs[],
			     size_t *size, const char *path,
			     const char *config_suffix,
			     const char *delim, const char *comment,
	                     const bool join_same_entries, const bool python_style,
			     bool (*callback)(const char *filename, const void *data),
			     const void *callback_data) {
  int i;

  if (config_dirs == NULL)
    return ECONF_NOFILE;

  i = 0;
  while (config_dirs[i] != NULL) {
    char *fulldir, *cp;

    if ((fulldir = malloc (strlen(path) + strlen (config_dirs[i]) + 1)) == NULL)
      return ECONF_NOMEM;

    cp = stpcpy (fulldir, path);
    stpcpy (cp, config_dirs[i++]);
    econf_err error = check_conf_dir(key_files, size,
				     fulldir, config_suffix, delim, comment,
	                             join_same_entries, python_style,
				     callback, callback_data);
    free (fulldir);
    if (error)
      return error;
  }
  return ECONF_SUCCESS;
}